

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,GenericForStatement *gen_for,void *data)

{
  size_t *psVar1;
  int line;
  uint uVar2;
  int iVar3;
  SyntaxTree *pSVar4;
  Function *this_00;
  GenerateFunction *pGVar5;
  GenericForStatement *pGVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  _List_node_base *p_Var13;
  int iVar14;
  Guard g_1;
  NameListData_conflict name_list_data;
  Guard l;
  ExpListData_conflict exp_list_data;
  Guard g;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  ulong local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  GenericForStatement *local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  uint local_58;
  int local_54;
  Guard local_50;
  
  local_a8._8_8_ = 0;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
             ::_M_manager;
  local_f8._8_8_ = 0;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:947:9)>
             ::_M_manager;
  local_f8._M_unused._M_object = this;
  local_a8._M_unused._M_object = this;
  Guard::Guard(&local_50,(function<void_()> *)&local_a8,(function<void_()> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  uVar7 = GenerateRegisterId(this);
  uVar8 = GenerateRegisterId(this);
  uVar9 = GenerateRegisterId(this);
  local_54 = uVar9 + 1;
  pSVar4 = (gen_for->exp_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_58 = uVar7;
  (*pSVar4->_vptr_SyntaxTree[2])(pSVar4,this);
  this_00 = this->current_function_->function_;
  line = gen_for->line_;
  pcStack_e0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
             ::_M_manager;
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:958:9)>
             ::_M_manager;
  local_f8._M_unused._M_object = this;
  local_f8._8_8_ = gen_for;
  local_c8._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_a8,(function<void_()> *)&local_f8,(function<void_()> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  local_c8._8_8_ = 0;
  pcStack_b0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
             ::_M_manager;
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:960:13)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  local_78._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_f8,(function<void_()> *)&local_c8,(function<void_()> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  uVar2 = this->current_function_->register_id_;
  local_c8._M_unused._M_member_pointer = local_c8._M_unused._M_member_pointer & 0xffffffffffffff00;
  pSVar4 = (gen_for->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  local_d0 = (ulong)uVar9;
  local_80 = gen_for;
  (*pSVar4->_vptr_SyntaxTree[2])(pSVar4,this);
  iVar3 = this->current_function_->register_id_;
  if (iVar3 - uVar2 != 0 && (int)uVar2 <= iVar3) {
    uVar9 = GenerateRegisterId(this);
    uVar10 = GenerateRegisterId(this);
    uVar11 = GenerateRegisterId(this);
    iVar14 = (uVar9 & 0xff) * 0x10000;
    Function::AddInstruction
              (this_00,(Instruction)((uVar7 & 0xff) * 0x100 + iVar14 + 0x6000000),line);
    Function::AddInstruction
              (this_00,(Instruction)((uVar8 & 0xff) * 0x100 + (uVar10 & 0xff) * 0x10000 + 0x6000000)
               ,line);
    Function::AddInstruction
              (this_00,(Instruction)
                       (((uint)local_d0 & 0xff) * 0x100 + (uVar11 & 0xff) * 0x10000 + 0x6000000),
               line);
    Function::AddInstruction
              (this_00,(Instruction)(((iVar3 - uVar2) + 1 & 0xff) + iVar14 + 0xc000300),line);
    iVar14 = iVar3 - uVar2;
    if (iVar14 != 0 && (int)uVar2 <= iVar3) {
      uVar9 = uVar9 << 8;
      uVar7 = uVar2 << 0x10;
      do {
        Function::AddInstruction
                  (this_00,(Instruction)((uVar7 & 0xff0000) + (uVar9 & 0xff00) + 0x6000000),line);
        uVar9 = uVar9 + 0x100;
        uVar7 = uVar7 + 0x10000;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    sVar12 = Function::AddInstruction
                       (this_00,(Instruction)((uVar2 & 0xff) << 0x10 | 0x11000000),line);
    pGVar6 = local_80;
    pGVar5 = this->current_function_;
    p_Var13 = (_List_node_base *)operator_new(0x20);
    p_Var13[1]._M_next = (_List_node_base *)pGVar6;
    *(undefined4 *)&p_Var13[1]._M_prev = 1;
    *(int *)((long)&p_Var13[1]._M_prev + 4) = (int)sVar12;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    psVar1 = &(pGVar5->loop_jumps_).
              super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    Function::AddInstruction
              (this_00,(Instruction)
                       ((uint)(byte)local_d0 * 0x10000 + (uVar2 & 0xff) * 0x100 + 0x6000000),line);
    pSVar4 = (pGVar6->block_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar4->_vptr_SyntaxTree[2])(pSVar4,this,0);
    Guard::~Guard((Guard *)&local_f8);
    sVar12 = Function::AddInstruction(this_00,(Instruction)0x12000000,line);
    pGVar5 = this->current_function_;
    p_Var13 = (_List_node_base *)operator_new(0x20);
    p_Var13[1]._M_next = (_List_node_base *)pGVar6;
    *(undefined4 *)&p_Var13[1]._M_prev = 0;
    *(int *)((long)&p_Var13[1]._M_prev + 4) = (int)sVar12;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    psVar1 = &(pGVar5->loop_jumps_).
              super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    Guard::~Guard((Guard *)&local_a8);
    Guard::~Guard(&local_50);
    return;
  }
  __assert_fail("name_start < name_end",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x3c7,
                "virtual void luna::CodeGenerateVisitor::Visit(GenericForStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(GenericForStatement *gen_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        // Init generic for statement data
        auto func_register = GenerateRegisterId();
        auto state_register = GenerateRegisterId();
        auto var_register = GenerateRegisterId();
        ExpListData exp_list_data{ func_register, var_register + 1 };
        gen_for->exp_list_->Accept(this, &exp_list_data);

        auto function = GetCurrentFunction();
        auto line = gen_for->line_;
        LOOP_GUARD(gen_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
            
            // Alloca registers for names
            auto name_start = GetNextRegisterId();
            NameListData name_list_data{ false };
            gen_for->name_list_->Accept(this, &name_list_data);
            auto name_end = GetNextRegisterId();
            assert(name_start < name_end);

            // Alloca temp registers for call iterate function
            auto temp_func = GenerateRegisterId();
            auto temp_state = GenerateRegisterId();
            auto temp_var = GenerateRegisterId();

            // Call iterate function
            auto move = [=](int dst, int src) {
                auto instruction = Instruction::ABCode(OpType_Move, dst, src);
                function->AddInstruction(instruction, line);
            };
            move(temp_func, func_register);
            move(temp_state, state_register);
            move(temp_var, var_register);

            auto instruction = Instruction::ABCCode(OpType_Call, temp_func,
                                                    2 + 1,  // Two args
                                                    name_end - name_start + 1);
            function->AddInstruction(instruction, line);

            // Copy results to registers of names
            for (auto name = name_start; name < name_end; ++name, ++temp_func)
                move(name, temp_func);

            // Break the loop when the first name value is nil
            instruction = Instruction::AsBxCode(OpType_JmpNil, name_start, 0);
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpTail);

            // Copy first name value to var_register
            move(var_register, name_start);

            gen_for->block_->Accept(this, nullptr);
        }
        

        // Jump to loop start
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(gen_for, index, LoopJumpInfo::JumpHead);
    }